

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::ValidateJSType
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  uint uVar1;
  long lVar2;
  EnumDescriptor *pEVar3;
  undefined1 local_48 [32];
  FieldDescriptor *local_28;
  
  uVar1 = *(uint *)(*(long *)(field + 0x38) + 0x50);
  if ((long)(int)uVar1 != 0) {
    if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
      local_48._0_8_ = FieldDescriptor::TypeOnceInit;
      local_28 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)local_48,&local_28
                );
    }
    if (((byte)field[2] < 0x13) && ((0x50058U >> ((byte)field[2] & 0x1f) & 1) != 0)) {
      if (2 < uVar1) {
        lVar2 = *(long *)(field + 8);
        pEVar3 = FieldOptions_JSType_descriptor();
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48
                       ,"Illegal jstype for int64, uint64, sint64, fixed64 or sfixed64 field: ",
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (*(long *)(pEVar3 + 0x28) + 8 + (long)(int)uVar1 * 0x20));
        AddError(this,(string *)(lVar2 + 0x20),&proto->super_Message,TYPE,(string *)local_48);
        if ((undefined1 *)local_48._0_8_ != local_48 + 0x10) {
          operator_delete((void *)local_48._0_8_);
        }
      }
    }
    else {
      AddError(this,(string *)(*(long *)(field + 8) + 0x20),&proto->super_Message,TYPE,
               "jstype is only allowed on int64, uint64, sint64, fixed64 or sfixed64 fields.");
    }
  }
  return;
}

Assistant:

const ServiceDescriptor* DescriptorPool::FindServiceByName(
    ConstStringParam name) const {
  return tables_->FindByNameHelper(this, name).service_descriptor();
}